

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha.c
# Opt level: O0

uint32_t tail32_be(void *v,size_t tail)

{
  uint8_t *p;
  size_t tail_local;
  void *v_local;
  undefined4 local_4;
  
  switch((uint)tail & 3) {
  case 0:
    local_4 = CONCAT13(*v,CONCAT12(*(undefined1 *)((long)v + 1),
                                   CONCAT11(*(undefined1 *)((long)v + 2),
                                            *(undefined1 *)((long)v + 3))));
    break;
  case 1:
    local_4 = (uint)*v;
    break;
  case 2:
    local_4 = (uint)CONCAT11(*v,*(undefined1 *)((long)v + 1));
    break;
  case 3:
    local_4 = (uint)CONCAT12(*v,CONCAT11(*(undefined1 *)((long)v + 1),*(undefined1 *)((long)v + 2)))
    ;
  }
  return local_4;
}

Assistant:

static __inline uint32_t tail32_be(const void *v, size_t tail) {
  const uint8_t *p = (const uint8_t *)v;
  switch (tail & 3) {
#if UNALIGNED_OK && __BYTE_ORDER__ == __ORDER_BIG_ENDIAN__
  /* For most CPUs this code is better when not needed
   * copying for alignment or byte reordering. */
  case 1:
    return p[0];
  case 2:
    return fetch16_be(p);
  case 3:
    return fetch16_be(p) << 8 | p[2];
  case 0:
    return fetch32_be(p);
#else
  /* For most CPUs this code is better than a
   * copying for alignment and/or byte reordering. */
  case 1:
    return p[0];
  case 2:
    return p[1] | (uint32_t)p[0] << 8;
  case 3:
    return p[2] | (uint32_t)p[1] << 8 | (uint32_t)p[0] << 16;
  case 0:
    return p[3] | (uint32_t)p[2] << 8 | (uint32_t)p[1] << 16 |
           (uint32_t)p[0] << 24;
#endif
  }
  unreachable();
}